

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

bool __thiscall
Jinx::Impl::Parser::CheckFunctionCallPart
          (Parser *this,FunctionSignaturePartsI *parts,size_t partsIndex,SymbolListCItr currSym,
          SymbolListCItr endSym,FunctionMatch *match)

{
  FunctionPartData *pFVar1;
  long *plVar2;
  SymbolType SVar3;
  pointer pFVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  pointer ptVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *pbVar10;
  long lVar11;
  long lVar12;
  FunctionMatch *pFVar13;
  FunctionMatch newMatch;
  pointer local_b8;
  Parser *local_b0;
  FunctionMatch *local_a8;
  SymbolListCItr local_a0;
  undefined1 local_98 [8];
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  _Stack_90;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *local_70;
  FunctionMatch local_68;
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  local_48;
  
  pFVar4 = (parts->
           super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((long)(parts->
                 super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pFVar4 >> 6) *
          -0x5555555555555555;
  if (currSym._M_current == endSym._M_current || (uVar7 < partsIndex || uVar7 - partsIndex == 0)) {
    return false;
  }
  if (((this->m_error != false) ||
      ((this->m_symbolList->
       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
       super__Vector_impl_data._M_finish == currSym._M_current)) ||
     (SVar3 = (currSym._M_current)->type, SVar3 == NewLine)) {
    if (pFVar4[partsIndex].optional != true) {
      return false;
    }
    return uVar7 - 1 == partsIndex;
  }
  local_a8 = match;
  local_b0 = this;
  local_a0._M_current = endSym._M_current;
  if (pFVar4[partsIndex].partType == Name) {
    if (((SVar3 != NameValue) && (pFVar4[partsIndex].optional == false)) &&
       (bVar5 = IsKeyword(SVar3), !bVar5)) {
      return false;
    }
    pbVar10 = pFVar4[partsIndex].names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_70 = pFVar4[partsIndex].names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar10 != local_70) {
      do {
        iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                compare(pbVar10,&(currSym._M_current)->text);
        pFVar13 = local_a8;
        if (iVar6 == 0) {
          pFVar1 = &local_a8->partData;
          local_98[0] = pFVar4[partsIndex].optional;
          _Stack_90._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
          _Stack_90._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((ulong)_Stack_90._M_impl.super__Vector_impl_data._M_finish &
                        0xffffffff00000000);
          std::
          vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
          ::emplace_back<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>
                    ((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
                      *)pFVar1,
                     (tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool> *)local_98);
          local_98 = (undefined1  [8])pFVar13->signature;
          std::
          vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ::vector((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                    *)&_Stack_90,pFVar1);
          bVar5 = CheckFunctionCallPart
                            (local_b0,parts,partsIndex + 1,currSym._M_current + 1,local_a0,
                             (FunctionMatch *)local_98);
          if (!bVar5) {
            std::
            _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
            ::~_Vector_base(&_Stack_90);
            goto LAB_00120ae4;
          }
          local_a8->signature = (FunctionSignature *)local_98;
          std::
          vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ::operator=(pFVar1,(vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                              *)&_Stack_90);
          goto LAB_00120ad0;
        }
        pbVar10 = pbVar10 + 1;
      } while (pbVar10 != local_70);
    }
    pFVar13 = local_a8;
    if (pFVar4[partsIndex].optional != true) goto LAB_00120ae4;
    local_98 = (undefined1  [8])local_a8->signature;
    pFVar1 = &local_a8->partData;
    std::
    vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ::vector((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
              *)&_Stack_90,pFVar1);
    local_68.signature._0_1_ = 1;
    local_68.partData.
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.partData.
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)local_68.partData.
                          super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
    std::
    vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
    ::emplace_back<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>
              ((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
                *)&_Stack_90,
               (tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool> *)&local_68);
    bVar5 = CheckFunctionCallPart
                      (local_b0,parts,partsIndex + 1,currSym,local_a0,(FunctionMatch *)local_98);
    if (bVar5) {
      pFVar13->signature = (FunctionSignature *)local_98;
      std::
      vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ::operator=(pFVar1,(vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                          *)&_Stack_90);
      goto LAB_00120ad0;
    }
  }
  else {
    local_70 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
               &match->partData;
    uVar7 = ((long)(match->partData).
                   super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(match->partData).
                   super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    local_b8 = (pointer)0x0;
    bVar5 = CheckVariable(this,currSym,(size_t *)&local_b8);
    if (((bVar5) || (bVar5 = CheckProperty(this,currSym,(size_t *)&local_b8), bVar5)) ||
       (bVar5 = CheckFunctionDeclaration(this,currSym,(size_t *)&local_b8), bVar5)) {
      if (local_b8 == (pointer)0x0) {
        ptVar8 = (pointer)0x0;
      }
      else {
        currSym._M_current = currSym._M_current + (long)local_b8;
        ptVar8 = local_b8;
      }
LAB_00120a21:
      pbVar10 = local_70;
      if (partsIndex <= uVar7 && uVar7 - partsIndex != 0) goto LAB_00120a26;
      local_98 = (undefined1  [8])((ulong)local_98 & 0xffffffffffffff00);
      _Stack_90._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(_Stack_90._M_impl.super__Vector_impl_data._M_finish._4_4_,1);
      _Stack_90._M_impl.super__Vector_impl_data._M_start = ptVar8;
      std::
      vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
      ::emplace_back<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>
                ((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
                  *)local_70,
                 (tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool> *)local_98);
    }
    else {
      SVar3 = (currSym._M_current)->type;
      if (SVar3 == ParenClose) {
        return false;
      }
      if (SVar3 == ParenOpen) {
        currSym._M_current = currSym._M_current + 1;
        lVar11 = 1;
        ptVar8 = (pointer)0x1;
        do {
          if (local_b0->m_error != false) {
            return false;
          }
          if (currSym._M_current ==
              (local_b0->m_symbolList->
              super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
              super__Vector_impl_data._M_finish) {
            return false;
          }
          SVar3 = (currSym._M_current)->type;
          if (SVar3 == NewLine) {
            return false;
          }
          lVar12 = -(ulong)(SVar3 == ParenClose);
          if (SVar3 == ParenOpen) {
            lVar12 = 1;
          }
          currSym._M_current = currSym._M_current + 1;
          ptVar8 = (pointer)((long)ptVar8 + 1);
          lVar11 = lVar11 + lVar12;
          local_b8 = ptVar8;
        } while (lVar11 != 0);
        goto LAB_00120a21;
      }
      bVar5 = IsConstant(SVar3);
      if ((bVar5) || ((currSym._M_current)->type == Not)) {
        currSym._M_current = currSym._M_current + 1;
        local_b8 = (pointer)0x1;
        ptVar8 = (pointer)0x1;
        goto LAB_00120a21;
      }
      if ((uVar7 < partsIndex || uVar7 - partsIndex == 0) ||
         (((bVar5 = IsOperator((currSym._M_current)->type), !bVar5 &&
           ((currSym._M_current)->type != Or)) && ((currSym._M_current)->type != And)))) {
        if (partsIndex == 0) {
          return false;
        }
        CheckFunctionCall((FunctionMatch *)local_98,local_b0,false,currSym,local_a0);
        if (local_98 == (undefined1  [8])0x0) {
          CheckFunctionCall(&local_68,local_b0,true,currSym,local_a0);
          local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
               _Stack_90._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_48._M_impl.super__Vector_impl_data._M_finish =
               _Stack_90._M_impl.super__Vector_impl_data._M_finish;
          local_48._M_impl.super__Vector_impl_data._M_start =
               _Stack_90._M_impl.super__Vector_impl_data._M_start;
          local_98 = (undefined1  [8])CONCAT71(local_68.signature._1_7_,local_68.signature._0_1_);
          _Stack_90._M_impl.super__Vector_impl_data._M_start =
               local_68.partData.
               super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          _Stack_90._M_impl.super__Vector_impl_data._M_finish =
               local_68.partData.
               super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          _Stack_90._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_68.partData.
               super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_68.partData.
          super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.partData.
          super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_68.partData.
          super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ::~_Vector_base(&local_48);
          std::
          _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ::~_Vector_base(&local_68.partData.
                           super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                         );
          if (local_98 == (undefined1  [8])0x0) {
            std::
            _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
            ::~_Vector_base(&_Stack_90);
            return false;
          }
          lVar11 = (long)_Stack_90._M_impl.super__Vector_impl_data._M_finish -
                   (long)_Stack_90._M_impl.super__Vector_impl_data._M_start >> 3;
          uVar9 = lVar11 * -0x5555555555555555;
          if (1 < uVar9) {
            currSym._M_current = currSym._M_current + lVar11 * 0x5555555555555568 + -0x38;
            local_b8 = (pointer)((long)local_b8 + (uVar9 - 1));
          }
        }
        else if ((long)_Stack_90._M_impl.super__Vector_impl_data._M_finish -
                 (long)_Stack_90._M_impl.super__Vector_impl_data._M_start != 0) {
          lVar11 = ((long)_Stack_90._M_impl.super__Vector_impl_data._M_finish -
                    (long)_Stack_90._M_impl.super__Vector_impl_data._M_start >> 3) *
                   -0x5555555555555555;
          lVar11 = lVar11 + (ulong)(lVar11 == 0);
          currSym._M_current = currSym._M_current + lVar11;
          local_b8 = (pointer)((long)local_b8 + lVar11);
        }
        std::
        _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
        ::~_Vector_base(&_Stack_90);
        ptVar8 = local_b8;
        goto LAB_00120a21;
      }
      currSym._M_current = currSym._M_current + 1;
      local_b8 = (pointer)0x1;
      ptVar8 = (pointer)0x1;
LAB_00120a26:
      plVar2 = (long *)((local_70->_M_dataplus)._M_p + partsIndex * 0x18 + 8);
      *plVar2 = (long)(&(ptVar8->
                        super__Tuple_impl<0UL,_Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>
                        ).super__Tuple_impl<1UL,_unsigned_long,_bool>.super__Tuple_impl<2UL,_bool> +
                      *plVar2);
      pbVar10 = local_70;
    }
    pFVar13 = local_a8;
    local_98 = (undefined1  [8])local_a8->signature;
    std::
    vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ::vector((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
              *)&_Stack_90,
             (vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
              *)pbVar10);
    bVar5 = CheckFunctionCallPart
                      (local_b0,parts,partsIndex + 1,currSym,local_a0,(FunctionMatch *)local_98);
    if ((bVar5) ||
       (bVar5 = CheckFunctionCallPart
                          (local_b0,parts,partsIndex,currSym,local_a0,(FunctionMatch *)local_98),
       bVar5)) {
      pFVar13->signature = (FunctionSignature *)local_98;
      std::
      vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ::operator=((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                   *)pbVar10,
                  (vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                   *)&_Stack_90);
LAB_00120ad0:
      std::
      _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ::~_Vector_base(&_Stack_90);
      return true;
    }
  }
  std::
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ::~_Vector_base(&_Stack_90);
  local_a8 = pFVar13;
LAB_00120ae4:
  return ((long)(local_a8->partData).
                super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_a8->partData).
                super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
         ((long)(parts->
                super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(parts->
                super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                )._M_impl.super__Vector_impl_data._M_start >> 6) * 0x5555555555555555 == 0;
}

Assistant:

inline_t bool Parser::CheckFunctionCallPart(const FunctionSignaturePartsI & parts, size_t partsIndex, SymbolListCItr currSym, SymbolListCItr endSym, FunctionMatch & match) const
	{
		// If we reach the end of the parts list, return failure
		if (partsIndex >= parts.size())
			return false;

		// If we've exceeded our range, return failure
		if (currSym == endSym)
			return false;

		const auto & part = parts[partsIndex];

		// Check for invalid symbol
		if (!IsSymbolValid(currSym))
			return part.optional && partsIndex == (parts.size() - 1);

		// Recursively iterate through all parts and match them against the signature.
		if (part.partType == FunctionSignaturePartType::Name)
		{
			if (!part.optional && currSym->type != SymbolType::NameValue && !IsKeyword(currSym->type))
				return false;

			// Attempt to find a matching part name
			bool matchedName = false;
			for (const auto & name : part.names)
			{
				if (name == currSym->text)
				{
					matchedName = true;
					match.partData.push_back(std::make_tuple(FunctionSignaturePartType::Name, 1, part.optional));
					auto newCurrSym = currSym;
					++newCurrSym;
					auto newMatch = match;
					if (CheckFunctionCallPart(parts, partsIndex + 1, newCurrSym, endSym, newMatch))
					{
						match = newMatch;
						return true;
					}
					break;
				}
			}

			// Check if this is an optional part and we haven't yet found a name match
			if (!matchedName && part.optional)
			{
				auto newMatch = match;
				newMatch.partData.push_back(std::make_tuple(FunctionSignaturePartType::Name, 0, true));
				if (CheckFunctionCallPart(parts, partsIndex + 1, currSym, endSym, newMatch))
				{
					match = newMatch;
					return true;
				}
			}
		}
		else
		{
			// Set a flag if this is the initial token in the expression.
			bool isInitialToken = partsIndex >= match.partData.size();

			// Check for valid expressions
			size_t symCount = 0;
			if (CheckVariable(currSym, &symCount) || CheckProperty(currSym, &symCount) || CheckFunctionDeclaration(currSym, &symCount))
			{
				for (size_t i = 0; i < symCount; ++i)
					++currSym;
			}
			else if (currSym->type == SymbolType::ParenOpen)
			{
				size_t parenCount = 1;
				symCount = 1;
				while (parenCount)
				{
					++currSym;
					++symCount;
					if (!IsSymbolValid(currSym))
						return false;
					if (currSym->type == SymbolType::ParenOpen)
						++parenCount;
					else if (currSym->type == SymbolType::ParenClose)
						--parenCount;
				}
				++currSym;
			}
			else if (currSym->type == SymbolType::ParenClose)
			{
				return false;
			}
			else if (IsConstant(currSym->type) || currSym->type == SymbolType::Not)
			{
				++currSym;
				symCount = 1;
			}
			else if (!isInitialToken && (IsOperator(currSym->type) || currSym->type == SymbolType::And || currSym->type == SymbolType::Or))
			{
				++currSym;
				symCount = 1;
			}
			else
			{
				if (partsIndex != 0)
				{
					FunctionMatch exprMatch = CheckFunctionCall(false, currSym, endSym);
					if (exprMatch.signature)
					{
						for (size_t i = 0; i < exprMatch.partData.size(); ++i)
						{
							++currSym;
							++symCount;
						}
					}
					else
					{
						exprMatch = CheckFunctionCall(true, currSym, endSym);
						if (exprMatch.signature)
						{
							for (size_t i = 1; i < exprMatch.partData.size(); ++i)
							{
								++currSym;
								++symCount;
							}
						}
						else
						{
							return false;
						}
					}
				}
				else
				{
					return false;
				}
			}

			// If our match structure isn't up to date, push new match items.  Otherwise,
			// advance our expression token count.  This will be important for determining
			// how many symbols we need to parse for an expression.
			if (isInitialToken)
				match.partData.push_back(std::make_tuple(FunctionSignaturePartType::Parameter, symCount, false));
			else
				std::get<1>(match.partData[partsIndex]) = std::get<1>(match.partData[partsIndex]) + symCount;

			// Store off current match structure
			auto newMatch = match;

			// Check to see if advancing part index leads to success
			if (CheckFunctionCallPart(parts, partsIndex + 1, currSym, endSym, newMatch))
			{
				match = newMatch;
				return true;
			}

			// Check symbols against the current part.
			if (CheckFunctionCallPart(parts, partsIndex, currSym, endSym, newMatch))
			{
				match = newMatch;
				return true;
			}
		}

		return match.partData.size() == parts.size();
	}